

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimdUtils.cpp
# Opt level: O3

void __thiscall
Js::SIMDUtils::SIMDStData(SIMDUtils *this,SIMDValue *data,SIMDValue simdValue,uint8 dataWidth)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  switch(simdValue.field_0._8_4_ << 0x1e | simdValue.field_0._8_4_ - 4U >> 2) {
  case 3:
    *(int *)(this + 0xc) = simdValue.field_0._4_4_;
  case 2:
    *(int *)(this + 8) = simdValue.field_0._0_4_;
  case 1:
    *(int *)(this + 4) = (int)((ulong)data >> 0x20);
  case 0:
    *(int *)this = (int)data;
    break;
  default:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/SimdUtils.cpp"
                                ,0x69,"((0))","UNREACHED");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  return;
}

Assistant:

void SIMDUtils::SIMDStData(SIMDValue *data, const SIMDValue simdValue, uint8 dataWidth)
    {
        // bitwise copy. Always use integer fields to avoid wrong copy of NaNs.
        switch (dataWidth)
        {
        case 16:
            data->i32[SIMD_W] = simdValue.i32[SIMD_W];
            // fall through
        case 12:
            data->i32[SIMD_Z] = simdValue.i32[SIMD_Z];
            // fall through
        case 8:
            data->i32[SIMD_Y] = simdValue.i32[SIMD_Y];
            // fall through
        case 4:
            data->i32[SIMD_X] = simdValue.i32[SIMD_X];
            break;
        default:
            Assert(UNREACHED);
        }
    }